

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.hpp
# Opt level: O2

string * __thiscall
toml::cxx::to_string_abi_cxx11_(string *__return_storage_ptr__,cxx *this,source_location *loc)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(long **)this == (long *)0x0) {
    __s = "";
  }
  else {
    __s = (char *)**(long **)this;
    if (__s == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," at line ",(allocator<char> *)&local_38);
      if (*(long *)this == 0) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(uint *)(*(long *)this + 0x10);
      }
      std::__cxx11::to_string((string *)&local_b8,uVar1);
      std::operator+(&local_78,&local_98,&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8," in unknown file",(allocator<char> *)&local_58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8)
      ;
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      this_00 = &local_98;
      goto LAB_003102d1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8," at line ",&local_d9);
  if (*(long *)this == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint *)(*(long *)this + 0x10);
  }
  std::__cxx11::to_string(&local_d8,uVar1);
  std::operator+(&local_98,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," in file ",&local_da);
  std::operator+(&local_78,&local_98,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_db);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  this_00 = &local_b8;
LAB_003102d1:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const source_location& loc)
{
    const char* fname = loc.file_name();
    if(fname)
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in file ") + std::string(fname);
    }
    else
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in unknown file");
    }
}